

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteTableNumberWithReloc
          (BinaryWriter *this,Index value,char *desc)

{
  if ((this->options_->relocatable == true) &&
     ((this->options_->features).reference_types_enabled_ == true)) {
    AddReloc(this,TableNumberLEB,value);
    WriteFixedS32Leb128(this->stream_,value,desc);
    return;
  }
  WriteS32Leb128(this->stream_,value,desc);
  return;
}

Assistant:

void BinaryWriter::WriteTableNumberWithReloc(Index value,
                                             const char* desc) {
  // Unless reference types are enabled, all references to tables refer to table
  // 0, so no relocs need be emitted when making relocatable binaries.
  if (options_.relocatable && options_.features.reference_types_enabled()) {
    AddReloc(RelocType::TableNumberLEB, value);
    WriteFixedS32Leb128(stream_, value, desc);
  } else {
    WriteS32Leb128(stream_, value, desc);
  }
}